

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

void __thiscall
notch::io::PlainTextNetworkReader::read_tag_value<std::__cxx11::string>
          (PlainTextNetworkReader *this,istream *in,string *tag,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  string inTag;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  read_tag_abi_cxx11_(&local_70,this,in);
  if (local_70._M_string_length == tag->_M_string_length) {
    if (local_70._M_string_length != 0) {
      iVar1 = bcmp(local_70._M_dataplus._M_p,(tag->_M_dataplus)._M_p,local_70._M_string_length);
      if (iVar1 != 0) goto LAB_00116dd1;
    }
    read_value<std::__cxx11::string>(&local_50,this,in,val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return;
  }
LAB_00116dd1:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_90,"tag \'",tag);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_b0 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_b0 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read_tag_value(std::istream &in, std::string const &tag, VALUE &val) {
        std::string inTag = read_tag(in);
        if (inTag != tag) {
            throw std::runtime_error("tag '" + tag + "' not found");
        }
        read_value<VALUE>(in, val);
    }